

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

bool create_debuginfo(GlobalVars *gv,HunkInfo *hi,Section *s)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  TargetExt *pTVar4;
  TargetExt *pTVar5;
  HunkInfo *hi_00;
  int iVar6;
  long in_RDX;
  uint32_t *optr;
  uint32_t *lptr;
  LineDebug *ldb;
  uint32_t base;
  int32_t len;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  HunkInfo *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  Section *in_stack_ffffffffffffffd0;
  int local_24;
  bool local_4;
  
  if (in_RDX == 0) {
    local_4 = 0;
  }
  else {
    nextword32(in_stack_ffffffffffffffc0);
    uVar1 = nextword32(in_stack_ffffffffffffffc0);
    if ((int)uVar1 < 3) {
      movehunkptr32(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    else {
      uVar2 = nextword32(in_stack_ffffffffffffffc0);
      uVar3 = nextword32(in_stack_ffffffffffffffc0);
      if (uVar3 == 0x4c494e45) {
        pTVar4 = addtargetext(in_stack_ffffffffffffffd0,
                              (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38),
                              (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x30),
                              (uint16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                              (uint32_t)in_stack_ffffffffffffffc8);
        uVar3 = testword32((HunkInfo *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                          );
        local_24 = uVar1 - (uVar3 + 3);
        pTVar5 = (TargetExt *)gethunkname(in_stack_ffffffffffffffc0);
        pTVar4[1].next = pTVar5;
        iVar6 = local_24 >> 1;
        pTVar4[1].id = (char)iVar6;
        pTVar4[1].sub_id = (char)((uint)iVar6 >> 8);
        pTVar4[1].flags = (short)((uint)iVar6 >> 0x10);
        pTVar5 = (TargetExt *)alloc((size_t)in_stack_ffffffffffffffc0);
        pTVar4[2].next = pTVar5;
        hi_00 = (HunkInfo *)alloc((size_t)in_stack_ffffffffffffffc0);
        *(HunkInfo **)&pTVar4[2].id = hi_00;
        for (; 0 < local_24; local_24 = local_24 + -2) {
          uVar1 = nextword32(hi_00);
          pTVar4 = (TargetExt *)((long)&pTVar5->next + 4);
          *(uint32_t *)&pTVar5->next = uVar1;
          uVar1 = nextword32(hi_00);
          *(uint32_t *)&hi_00->hunkbase = uVar1 + uVar2;
          hi_00 = (HunkInfo *)((long)&hi_00->hunkbase + 4);
          pTVar5 = pTVar4;
        }
      }
      else {
        movehunkptr32(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static bool create_debuginfo(struct GlobalVars *gv,struct HunkInfo *hi,
                             struct Section *s)
/* read amigahunk/ehf debugging informations */
{
  int32_t len;
  uint32_t base;

  if (s) {
    nextword32(hi);
    if ((len = nextword32(hi)) >= 3) {
      base = nextword32(hi);
      switch (nextword32(hi)) {

        case 0x4c494e45:  /* "LINE" - line/offset table and source name */
          {
            struct LineDebug *ldb;
            uint32_t *lptr,*optr;

            ldb = (struct LineDebug *)addtargetext(s,TGEXT_AMIGAOS,
                                                   SUBID_LINE,0,
                                                   sizeof(struct LineDebug));
            len -= testword32(hi) + 3; /* number of longwords for file name */
            ldb->source_name = gethunkname(hi);
            ldb->num_entries = len >> 1;
            lptr = ldb->lines = alloc(ldb->num_entries * sizeof(uint32_t));
            optr = ldb->offsets = alloc(ldb->num_entries * sizeof(uint32_t));
            while (len > 0) {
              *lptr++ = nextword32(hi);
              *optr++ = nextword32(hi) + base;
              len -= 2;
            }
          }
          break;

        default:
          movehunkptr32(hi,len-2);  /* ignore unknown debug hunk */
          break;
      }
    }
    else /* too short... ignore */
      movehunkptr32(hi,len);
    return TRUE;
  }
  return FALSE;
}